

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TZX.cpp
# Opt level: O2

void __thiscall Storage::Tape::TZX::get_data_block(TZX *this,DataBlock *data_block)

{
  post_pulses(this,data_block->length_of_pilot_tone,data_block->length_of_pilot_pulse);
  post_pulse(this,data_block->length_of_sync_first_pulse);
  post_pulse(this,data_block->length_of_sync_second_pulse);
  get_data(this,&data_block->data);
  return;
}

Assistant:

void TZX::get_data_block(const DataBlock &data_block) {
	// Output pilot tone.
	post_pulses(data_block.length_of_pilot_tone, data_block.length_of_pilot_pulse);

	// Output sync pulses.
	post_pulse(data_block.length_of_sync_first_pulse);
	post_pulse(data_block.length_of_sync_second_pulse);

	get_data(data_block.data);
}